

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall
QList<DomStringPropertySpecification_*>::clear(QList<DomStringPropertySpecification_*> *this)

{
  Data *pDVar1;
  QArrayData *pQVar2;
  DomStringPropertySpecification **ppDVar3;
  longlong lVar4;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->d).size == 0) goto LAB_0016e7f9;
  pDVar1 = (this->d).d;
  if (pDVar1 == (Data *)0x0) {
LAB_0016e795:
    lVar4 = 0;
  }
  else {
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2) {
      (this->d).size = 0;
      goto LAB_0016e7f9;
    }
    if (pDVar1 == (Data *)0x0) goto LAB_0016e795;
    lVar4 = (pDVar1->super_QArrayData).alloc;
  }
  local_20 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  ppDVar3 = (DomStringPropertySpecification **)QArrayData::allocate(&local_20,8,0x10,lVar4,KeepSize)
  ;
  pQVar2 = &((this->d).d)->super_QArrayData;
  (this->d).d = (Data *)local_20;
  (this->d).ptr = ppDVar3;
  (this->d).size = 0;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,8,0x10);
    }
  }
LAB_0016e7f9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }